

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O3

_Bool hash_final_matches(permutation_fptr permutation,ascon_hash_ctx_t *ctx,uint8_t *expected_digest
                        ,size_t expected_digest_len)

{
  bool bVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t uVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = bigendian_decode_varlen(ctx->buffer,ctx->buffer_len);
  (ctx->sponge).x0 =
       0x80L << ((ulong)(byte)(ctx->buffer_len * -8 + 0x38) & 0x3f) ^ uVar2 ^ (ctx->sponge).x0;
  ascon_permutation_12(&ctx->sponge);
  if (expected_digest_len < 9) {
    bVar6 = false;
  }
  else {
    bVar1 = false;
    do {
      bVar6 = bVar1;
      uVar2 = bigendian_decode_u64(expected_digest);
      uVar3 = uVar2 ^ (ctx->sponge).x0;
      expected_digest_len = expected_digest_len - 8;
      expected_digest = expected_digest + 8;
      (*permutation)(&ctx->sponge);
      bVar1 = bVar6 || uVar3 != 0;
    } while (8 < expected_digest_len);
    bVar6 = bVar6 || uVar3 != 0;
  }
  uVar2 = mask_most_signif_bytes((uint_fast8_t)expected_digest_len);
  uVar4 = bigendian_decode_varlen(expected_digest,(uint_fast8_t)expected_digest_len);
  uVar3 = (ctx->sponge).x0;
  lVar5 = 0;
  (ctx->sponge).x0 = 0;
  (ctx->sponge).x1 = 0;
  (ctx->sponge).x2 = 0;
  (ctx->sponge).x3 = 0;
  (ctx->sponge).x4 = 0;
  do {
    ctx->buffer[lVar5] = '\0';
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  ctx->buffer_len = '\0';
  ctx->flow_state = '\0';
  lVar5 = -6;
  do {
    ctx[1].buffer[lVar5 + -0x28] = '\0';
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  return (uVar3 & uVar2) == uVar4 && !bVar6;
}

Assistant:

static bool
hash_final_matches(permutation_fptr permutation,
                   ascon_hash_ctx_t* const ctx,
                   const uint8_t* expected_digest,
                   size_t expected_digest_len)
{
    // If there is any remaining less-than-a-block data to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->sponge.x0 ^= bigendian_decode_varlen(ctx->buffer, ctx->buffer_len);
    ctx->sponge.x0 ^= PADDING(ctx->buffer_len);
    ascon_permutation_12(&ctx->sponge);
    // Squeeze the digest from the inner state 8 bytes at the time to compare
    // it chunk by chunk with the expected digest
    uint64_t expected_digest_chunk;
    bool digests_differ = false;
    while (expected_digest_len > ASCON_RATE)
    {
        // Note: converting the expected digest from uint8_t[] to uint64_t
        // for a faster comparison. It has to be decoded explicitly to ensure
        // it works the same on all platforms, regardless of endianness.
        // Type-punning like `*(uint64_t*) expected_digest` is NOT portable.
        //
        // Constant time comparison expected vs computed digest chunk
        expected_digest_chunk = bigendian_decode_u64(expected_digest);
        digests_differ |= (expected_digest_chunk ^ ctx->sponge.x0);
        expected_digest_len -= sizeof(expected_digest_chunk);
        expected_digest += sizeof(expected_digest_chunk);
        // Permute and go to next chunk
        permutation(&ctx->sponge);
    }
    // Extract the remaining n most significant bytes of expected/computed digests
    const uint64_t ms_mask = mask_most_signif_bytes((uint_fast8_t) expected_digest_len);
    expected_digest_chunk = bigendian_decode_varlen(
            expected_digest, (uint_fast8_t) expected_digest_len);
    // Constant time comparison expected vs computed chunk
    digests_differ |= (expected_digest_chunk ^ (ctx->sponge.x0 & ms_mask));
    // Final security cleanup of the internal state and buffer.
    ascon_hash_cleanup(ctx);
    return !digests_differ; // True if they are equal
}